

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall
jsonip::detail::struct_helper<P>::member_writer<jsonip::writer<true>>::operator()
          (member_writer<jsonip::writer<true>> *this,integral_c<int,_0> *param_1)

{
  writer<true> *pwVar1;
  type str;
  type piVar2;
  integral_c<int,_0> *param_1_local;
  member_writer<jsonip::writer<true>_> *this_local;
  
  pwVar1 = *(writer<true> **)this;
  str = boost::fusion::extension::struct_member_name<P,_0>::call();
  writer<true>::new_member(pwVar1,str);
  pwVar1 = *(writer<true> **)this;
  piVar2 = boost::fusion::at<mpl_::integral_c<int,0>,P>(*(P **)(this + 8));
  arithmetic_helper<int>::write<jsonip::writer<true>>(pwVar1,*piVar2);
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }